

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::SelectCols::dim_forward
          (Dim *__return_storage_ptr__,SelectCols *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  uint local_18;
  undefined4 local_14;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pDVar1 == 0x24) && (pDVar1->nd == 2)) {
    _local_18 = CONCAT44((int)((ulong)((long)(this->pcols->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->pcols->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 2),
                         pDVar1->d[0]);
    x._M_len = 2;
    x._M_array = &local_18;
    Dim::Dim(__return_storage_ptr__,x);
    return __return_storage_ptr__;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Bad arguments in SelectCols: ");
  poVar2 = operator<<(poVar2,xs);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to SelectCols");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SelectCols::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].ndims() != 2) {
    cerr << "Bad arguments in SelectCols: " << xs << endl;
    throw std::invalid_argument("invalid arguments to SelectCols");
  }
  unsigned ncols = pcols->size();
  return Dim({xs[0].rows(), ncols});
}